

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<Replace>::moveAppend
          (QGenericArrayOps<Replace> *this,Replace *b,Replace *e)

{
  qsizetype *pqVar1;
  Replace *pRVar2;
  
  if (b != e) {
    pRVar2 = (this->super_QArrayDataPointer<Replace>).ptr;
    for (; b < e; b = b + 1) {
      Replace::Replace(pRVar2 + (this->super_QArrayDataPointer<Replace>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<Replace>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }